

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

shared_ptr<const_fasttext::Dictionary> __thiscall fasttext::FastText::getDictionary(FastText *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_fasttext::Dictionary> *in_RSI;
  element_type *in_RDI;
  shared_ptr<const_fasttext::Dictionary> sVar1;
  
  std::shared_ptr<fasttext::Dictionary_const>::shared_ptr<fasttext::Dictionary,void>
            (in_RSI,(shared_ptr<fasttext::Dictionary> *)in_RDI);
  sVar1.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<const_fasttext::Dictionary>)
         sVar1.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Dictionary> FastText::getDictionary() const {
  return dict_;
}